

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildProfiled2CallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,ProfileId profileId2)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  ValueType valueType;
  undefined4 *puVar4;
  JITTimeProfileInfo *this_01;
  ArrayCallSiteInfo *this_02;
  Instr *this_03;
  JitProfilingInstr *pJVar5;
  TypeId typeId;
  undefined6 in_register_0000008a;
  OpCode newOpcode;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  RegSlot local_40;
  RegSlot local_3c;
  undefined4 local_38;
  OpCode local_32 [4];
  OpCode opcode_local;
  
  local_3c = returnValue;
  local_32[0] = opcode;
  if ((opcode & ~MediumLayoutPrefix) != ProfiledNewScObjArray) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19c3,
                       "(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread)"
                       ,
                       "opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread"
                      );
    if (!bVar2) goto LAB_00499327;
    *puVar4 = 0;
  }
  local_38 = (undefined4)CONCAT62(in_register_0000008a,argCount);
  local_40 = function;
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  newOpcode = local_32[0];
  PVar3 = profileId;
  if (local_3c == 0xffffffff) {
    newOpcode = NewScObject;
    if (local_32[0] == NewScObjArraySpread) {
      newOpcode = NewScObjectSpread;
    }
    typeId = TypeIds_Array;
  }
  else {
    bVar2 = Func::HasArrayInfo(this->m_func);
    if (bVar2) {
      this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
      this_02 = JITTimeProfileInfo::GetArrayCallSiteInfo(this_01,profileId2);
      if ((this_02 != (ArrayCallSiteInfo *)0x0) &&
         (bVar2 = Func::IsJitInDebugMode(this->m_func), !bVar2)) {
        bVar2 = Js::ArrayCallSiteInfo::IsNativeIntArray(this_02);
        PVar3 = profileId2;
        if (bVar2) {
          typeId = TypeIds_NativeIntArray;
        }
        else {
          bVar2 = Js::ArrayCallSiteInfo::IsNativeFloatArray(this_02);
          typeId = (uint)bVar2 + (uint)bVar2 * 2 + TypeIds_Array;
        }
        goto LAB_00499225;
      }
    }
    newOpcode = NewScObject;
    if (local_32[0] == NewScObjArraySpread) {
      newOpcode = NewScObjectSpread;
    }
    typeId = TypeIds_Array;
  }
LAB_00499225:
  this_03 = BuildCallI_Helper(this,newOpcode,offset,local_3c,local_40,(ArgSlot)local_38,PVar3,
                              CallFlags_None,0xffffffff);
  this_00 = this_03->m_dst;
  if (this_00 != (Opnd *)0x0) {
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_42.field_0);
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_44.field_0,true);
    valueType = ValueType::SetArrayTypeId((ValueType *)&local_46.field_0,typeId);
    IR::Opnd::SetValueType(this_00,valueType);
  }
  if (this_03->m_kind == InstrKindJitProfiling) {
    pJVar5 = IR::Instr::AsJitProfilingInstr(this_03);
    pJVar5->field_0x60 = pJVar5->field_0x60 | 4;
    pJVar5 = IR::Instr::AsJitProfilingInstr(this_03);
    pJVar5->arrayProfileId = profileId2;
    pJVar5 = IR::Instr::AsJitProfilingInstr(this_03);
    if (pJVar5->profileId != profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x19f5,"(callInstr->AsJitProfilingInstr()->profileId == profileId)",
                         "callInstr->AsJitProfilingInstr()->profileId == profileId");
      if (!bVar2) {
LAB_00499327:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiled2CallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::ProfileId profileId2)
{
    Assert(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(opcode);

    Js::OpCode useOpcode = opcode;
    // We either want to provide the array profile id (profileId2) to the native array creation or the call profileid (profileId)
    //     to the call to NewScObject
    Js::ProfileId useProfileId = profileId2;
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (returnValue != Js::Constants::NoRegister)
    {
        Js::ArrayCallSiteInfo *arrayCallSiteInfo = nullptr;
        if (m_func->HasArrayInfo())
        {
            arrayCallSiteInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId2);
        }
        if (arrayCallSiteInfo && !m_func->IsJitInDebugMode())
        {
            if (arrayCallSiteInfo->IsNativeIntArray())
            {
                arrayTypeId = Js::TypeIds_NativeIntArray;
            }
            else if (arrayCallSiteInfo->IsNativeFloatArray())
            {
                arrayTypeId = Js::TypeIds_NativeFloatArray;
            }
        }
        else
        {
            useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            useProfileId = profileId;
        }
    }
    else
    {
        useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
        useProfileId = profileId;
    }
    IR::Instr * callInstr = BuildCallI_Helper(useOpcode, offset, returnValue, function, argCount, useProfileId);
    if (callInstr->GetDst())
    {
        callInstr->GetDst()->SetValueType(
            ValueType::GetObject(ObjectType::Array).ToLikely().SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    }
    if (callInstr->IsJitProfilingInstr())
    {
        // If we happened to decide in BuildCallI_Helper that this should be a jit profiling instr, then save the fact that it is
        //    a "new Array(args, ...)" call and also save the array profile id (profileId2)
        callInstr->AsJitProfilingInstr()->isNewArray = true;
        callInstr->AsJitProfilingInstr()->arrayProfileId = profileId2;
        // Double check that this profileId made it to the JitProfilingInstr like we expect it to.
        Assert(callInstr->AsJitProfilingInstr()->profileId == profileId);
    }
}